

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

counting_iterator
fmt::v10::detail::write_escaped_string<char,fmt::v10::detail::counting_iterator>
          (counting_iterator out,basic_string_view<char> str)

{
  char *pcVar1;
  char *in_RCX;
  counting_iterator it;
  counting_iterator out_00;
  detail *begin;
  detail *this;
  find_escape_result<char> escape;
  find_escape_result<char> local_38;
  
  out_00.count_ = out.count_ + 1;
  begin = (detail *)str.data_ + str.size_;
  this = (detail *)str.data_;
  do {
    find_escape(&local_38,this,(char *)begin,in_RCX);
    pcVar1 = local_38.end;
    out_00.count_ = (out_00.count_ - (long)this) + (long)local_38.begin;
    if ((detail *)local_38.end == (detail *)0x0) break;
    out_00 = write_escaped_cp<fmt::v10::detail::counting_iterator,char>(out_00,&local_38);
    this = (detail *)pcVar1;
  } while ((detail *)pcVar1 != begin);
  return (counting_iterator)(out_00.count_ + 1);
}

Assistant:

auto write_escaped_string(OutputIt out, basic_string_view<Char> str)
    -> OutputIt {
  *out++ = static_cast<Char>('"');
  auto begin = str.begin(), end = str.end();
  do {
    auto escape = find_escape(begin, end);
    out = copy_str<Char>(begin, escape.begin, out);
    begin = escape.end;
    if (!begin) break;
    out = write_escaped_cp<OutputIt, Char>(out, escape);
  } while (begin != end);
  *out++ = static_cast<Char>('"');
  return out;
}